

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O3

int jpc_mqenc_dump(jpc_mqenc_t *mqenc,FILE *out)

{
  jpc_mqstate_t *pjVar1;
  
  fprintf((FILE *)out,"AREG = %08lx, CREG = %08lx, CTREG = %lu\n",mqenc->areg,mqenc->creg,
          mqenc->ctreg);
  pjVar1 = *mqenc->curctx;
  fprintf((FILE *)out,"IND = %02ld, MPS = %d, QEVAL = %04lx\n",(long)(pjVar1 + -0xa4f6) >> 5,
          (ulong)pjVar1->mps,pjVar1->qeval);
  return 0;
}

Assistant:

int jpc_mqenc_dump(const jpc_mqenc_t *mqenc, FILE *out)
{
	fprintf(out, "AREG = %08"PRIxFAST32", CREG = %08"PRIxFAST32", CTREG = %"PRIuFAST32"\n",
	  mqenc->areg, mqenc->creg, mqenc->ctreg);
	fprintf(out, "IND = %02"PRIdPTR", MPS = %d, QEVAL = %04"PRIxFAST16"\n",
	  *mqenc->curctx - jpc_mqstates, (*mqenc->curctx)->mps,
	  (*mqenc->curctx)->qeval);
	return 0;
}